

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

bool __thiscall
google::protobuf::Reflection::IsInlinedStringDonated
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t has_bit_index;
  Nullable<const_char_*> failure_msg;
  uint32_t *has_bit_set;
  uint local_2c;
  LogMessageFatal local_28;
  
  has_bit_index = internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
  local_2c = 0;
  local_28.super_LogMessage.errno_saver_.saved_errno_ = has_bit_index;
  failure_msg = absl::lts_20250127::log_internal::Check_GTImpl<unsigned_int,unsigned_int>
                          ((uint *)&local_28,&local_2c,"index > 0u");
  if (failure_msg == (Nullable<const_char_*>)0x0) {
    has_bit_set = GetInlinedStringDonatedArray(this,message);
    bVar1 = anon_unknown_6::IsIndexInHasBitSet(has_bit_set,has_bit_index);
    return bVar1;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_reflection.cc"
             ,0xbc3,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_28);
}

Assistant:

bool Reflection::IsInlinedStringDonated(const Message& message,
                                        const FieldDescriptor* field) const {
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  return IsIndexInHasBitSet(GetInlinedStringDonatedArray(message), index);
}